

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O1

int __thiscall TPZCheckMesh::VerifyConnect(TPZCheckMesh *this,int connect)

{
  TPZCompEl *pTVar1;
  int iVar2;
  TPZConnect *pTVar3;
  ostream *poVar4;
  long lVar5;
  long *plVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  TPZCompElSide large;
  TPZStack<int,_10> deplist;
  TPZCompElSide large_1;
  int local_ac;
  TPZCheckMesh local_a8;
  long local_90;
  TPZManVector<int,_10> local_88;
  TPZCompElSide local_40;
  
  FindElement((TPZCheckMesh *)&local_88,(int)this);
  local_90 = (long)connect;
  pTVar3 = TPZChunkVector<TPZConnect,_10>::operator[]
                     (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,local_90);
  local_ac = 1;
  TPZCompElSide::LowerLevelElementList((TPZCompElSide *)&local_a8,(int)&local_88);
  if ((pTVar3->fDependList != (TPZDepend *)0x0) && (local_a8.fMesh == (TPZCompMesh *)0x0)) {
    poVar4 = this->fOut;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Connect ",8);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,connect);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," has dependency but no large element\n",0x25);
    local_ac = 0;
  }
  if (((pTVar3->fNShape != 0) && (pTVar3->fDependList == (TPZDepend *)0x0)) &&
     (local_a8.fMesh != (TPZCompMesh *)0x0)) {
    poVar4 = this->fOut;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Connect ",8);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,connect);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," has no dependency but has large element\n",0x29);
    local_ac = 0;
  }
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_88);
  BuildDependList(this,connect,(TPZStack<int,_10> *)&local_88);
  if (0 < (int)(uint)local_88.super_TPZVec<int>.fNElements) {
    uVar10 = (ulong)((uint)local_88.super_TPZVec<int>.fNElements & 0x7fffffff);
    uVar7 = 0;
    local_a8._16_8_ = uVar10;
    do {
      FindElement(&local_a8,(int)this);
      TPZCompElSide::LowerLevelElementList(&local_40,(int)&local_a8);
      pTVar1 = local_40.fEl;
      if (local_40.fEl == (TPZCompEl *)0x0) {
        poVar4 = this->fOut;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"VerifyConnect of connect ",0x19);
        plVar6 = (long *)std::ostream::operator<<(poVar4,connect);
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        std::ostream::flush();
        poVar4 = this->fOut;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"deplist = ",10);
        poVar4 = ::operator<<(poVar4,&local_88.super_TPZVec<int>);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," deplist[id] = ",0xf);
        plVar6 = (long *)std::ostream::operator<<(poVar4,local_88.super_TPZVec<int>.fStore[uVar7]);
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        std::ostream::flush();
        poVar4 = this->fOut;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"Connect index of connect which is restrained deplist[id] = ",0x3b);
        plVar6 = (long *)std::ostream::operator<<(poVar4,local_88.super_TPZVec<int>.fStore[uVar7]);
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        std::ostream::flush();
        pTVar3 = TPZChunkVector<TPZConnect,_10>::operator[]
                           (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                            (long)local_88.super_TPZVec<int>.fStore[uVar7]);
        TPZConnect::Print(pTVar3,this->fMesh,this->fOut);
        poVar4 = this->fOut;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"Element/side which contains deplist[id] side = ",0x2f);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)local_a8.fOut);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        (**(code **)(*(long *)local_a8.fMesh + 200))(local_a8.fMesh,this->fOut);
        poVar4 = this->fOut;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"VerifyConnect of ",0x11);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,connect);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," inconsistent\n",0xe);
LAB_010ddac8:
        local_ac = 0;
      }
      else {
        iVar2 = (**(code **)(*(long *)local_40.fEl + 0x90))(local_40.fEl);
        iVar8 = 0;
        iVar9 = 0;
        if (0 < iVar2) {
          do {
            lVar5 = (**(code **)(*(long *)pTVar1 + 0xa0))(pTVar1,iVar8);
            iVar9 = iVar8;
            if (lVar5 == local_90) break;
            iVar8 = iVar8 + 1;
            iVar9 = iVar2;
          } while (iVar2 != iVar8);
        }
        uVar10 = local_a8._16_8_;
        if (iVar9 == iVar2) {
          poVar4 = this->fOut;
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"VerifyConnect of ",0x11);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,connect);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," inconsistent\n",0xe);
          goto LAB_010ddac8;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar10);
  }
  TPZManVector<int,_10>::~TPZManVector(&local_88);
  return local_ac;
}

Assistant:

int TPZCheckMesh::VerifyConnect(int connect) {

    int check = 1;

    {
        TPZCompElSide elcon = FindElement(connect);
        TPZConnect &c = fMesh->ConnectVec()[connect];
        TPZCompElSide large = elcon.LowerLevelElementList(1);
        if (c.HasDependency() && !large) {
            *fOut << "Connect " << connect << " has dependency but no large element\n";
            check = 0;
        }
        if(c.NShape() && !c.HasDependency() && large)
        {
            *fOut << "Connect " << connect << " has no dependency but has large element\n";
            check = 0;
        }
    }
	TPZStack<int> deplist;
	BuildDependList(connect,deplist);
	int ndep = deplist.NElements();
	int id;
	for(id=0; id<ndep; id++) {
		TPZCompElSide smalll = FindElement(deplist[id]);
		TPZCompElSide large = smalll.LowerLevelElementList(1);
		if(!large.Exists()) {
			check = 0;
            (*fOut) << "VerifyConnect of connect " << connect << std::endl;
            (*fOut) << "deplist = " << deplist << " deplist[id] = " << deplist[id] << std::endl;
            (*fOut) << "Connect index of connect which is restrained deplist[id] = " << deplist[id] << std::endl;
            TPZConnect &c = fMesh->ConnectVec()[deplist[id]];
            c.Print(*fMesh,(*fOut));
            (*fOut) << "Element/side which contains deplist[id] side = " << smalll.Side() << "\n";
            smalll.Element()->Print(*fOut);
			(*fOut) << "VerifyConnect of " << connect << " inconsistent\n";
			continue;
		}
		TPZCompEl *cel = large.Element();
		int ncl = cel->NConnects();
		int icl;
		for(icl=0; icl<ncl; icl++) {
			if(cel->ConnectIndex(icl) == connect) break;
		}
		if(icl == ncl) {
			check = 0;
			(*fOut) << "VerifyConnect of " << connect << " inconsistent\n";
		}
	}
	return check;
}